

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_action.cpp
# Opt level: O2

bool __thiscall
cppnet::EpollEventActions::MakeEpollEvent
          (EpollEventActions *this,Event *event,epoll_event **ep_event)

{
  epoll_event *peVar1;
  SingletonLogger *this_00;
  shared_ptr<cppnet::Socket> sock;
  shared_ptr<cppnet::RWSocket> rw_sock;
  __shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2> local_50;
  __shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<cppnet::Socket> local_30;
  
  std::__shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_50,&event->_socket);
  if (local_50._M_ptr == (element_type *)0x0) {
    this_00 = Singleton<cppnet::SingletonLogger>::Instance();
    SingletonLogger::Warn
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/event/epoll/epoll_action.cpp"
               ,0x187,"socket is already destroyed! event %s","AddSendEvent");
  }
  else {
    std::dynamic_pointer_cast<cppnet::RWSocket,cppnet::Socket>(&local_30);
    std::__shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,
               (__shared_ptr<cppnet::AlloterWrap,_(__gnu_cxx::_Lock_policy)2> *)
               &local_30.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].
                _event_actions);
    peVar1 = AlloterWrap::PoolNew<epoll_event>(local_40._M_ptr);
    *ep_event = peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    peVar1 = *ep_event;
    *(undefined4 *)((long)&peVar1->data + 4) = 0;
    *(undefined8 *)peVar1 = 0;
    peVar1 = *ep_event;
    event->_data = peVar1;
    (peVar1->data).ptr = event;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_30.super___shared_ptr<cppnet::Socket,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
    ;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  return local_50._M_ptr != (element_type *)0x0;
}

Assistant:

bool EpollEventActions::MakeEpollEvent(Event* event, epoll_event* &ep_event) {
    auto sock = event->GetSocket();
    if (!sock) {
        LOG_WARN("socket is already destroyed! event %s", "AddSendEvent");
        return false;
    }

    auto rw_sock = std::dynamic_pointer_cast<RWSocket>(sock);
    ep_event = rw_sock->GetAlloter()->PoolNew<epoll_event>();
    memset(ep_event, 0, sizeof(epoll_event));
    event->SetData(ep_event);
    ep_event->data.ptr = (void*)event;

    return true;
}